

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive(JavascriptString *this,JavascriptString *pstRight)

{
  CharCount appendCharLength;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptString *pJVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char16 *pcVar6;
  char16_t *pcVar7;
  
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x18c,"(pstRight)","pstRight");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((this->m_pszValue).ptr == (char16_t *)0x0) {
    bVar2 = VarIsImpl<Js::CompoundString>(&this->super_RecyclableObject);
    if (bVar2) {
      ConcatDestructive_Compound(this,pstRight);
      return this;
    }
    if (((this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
         _vptr_IRecyclerVisitedObject == (_func_int **)VirtualTableInfo<Js::ConcatString>::Address)
       && (pJVar5 = ConcatDestructive_ConcatToCompound(this,pstRight),
          pJVar5 != (JavascriptString *)0x0)) {
      return pJVar5;
    }
    goto LAB_00d209e6;
  }
  appendCharLength = pstRight->m_charLength;
  if (this->m_charLength == 0 || appendCharLength == 0) {
    pJVar5 = ConcatDestructive_OneEmpty(this,pstRight);
LAB_00d20971:
    bVar2 = false;
  }
  else {
    bVar3 = CompoundString::ShouldAppendChars(this->m_charLength);
    pJVar5 = (JavascriptString *)CONCAT71(extraout_var,bVar3);
    bVar2 = true;
    if (bVar3) {
      bVar3 = CompoundString::ShouldAppendChars(appendCharLength);
      pJVar5 = (JavascriptString *)CONCAT71(extraout_var_00,bVar3);
      if (bVar3) {
        pJVar5 = ConcatDestructive_CompoundAppendChars(this,pstRight);
        goto LAB_00d20971;
      }
    }
  }
  if (!bVar2) {
    return pJVar5;
  }
LAB_00d209e6:
  StringProfiler::RecordConcatenation
            ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,this->m_charLength,
             pstRight->m_charLength,ConcatType_ConcatTree);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StringConcatPhase);
  if (bVar2) {
    if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
      pcVar6 = L"";
    }
    else {
      pcVar6 = GetString(pstRight);
    }
    if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
      pcVar7 = L"...";
    }
    else {
      pcVar7 = L"";
      if (8 < pstRight->m_charLength) {
        pcVar7 = L"...";
      }
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - creating ConcatString\n",
                  pcVar6,pcVar7);
    Output::Flush();
  }
  pJVar5 = (JavascriptString *)ConcatString::New(this,pstRight);
  return pJVar5;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive(JavascriptString* pstRight)
    {
        Assert(pstRight);

        if(!IsFinalized())
        {
            if(VarIs<CompoundString>(this))
            {
                return ConcatDestructive_Compound(pstRight);
            }

            if(VirtualTableInfo<ConcatString>::HasVirtualTable(this))
            {
                JavascriptString *const s = ConcatDestructive_ConcatToCompound(pstRight);
                if(s)
                {
                    return s;
                }
            }
        }
        else
        {
            const CharCount leftLength = GetLength();
            const CharCount rightLength = pstRight->GetLength();
            if(leftLength == 0 || rightLength == 0)
            {
                return ConcatDestructive_OneEmpty(pstRight);
            }

            if(CompoundString::ShouldAppendChars(leftLength) && CompoundString::ShouldAppendChars(rightLength))
            {
                return ConcatDestructive_CompoundAppendChars(pstRight);
            }
        }

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_ConcatTree);
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - creating ConcatString\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        return ConcatString::New(this, pstRight);
    }